

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dense_main.cc
# Opt level: O0

void __thiscall MyNN::MyNN(MyNN *this)

{
  initializer_list<unsigned_long> dims;
  initializer_list<unsigned_long> dims_00;
  initializer_list<unsigned_long> dims_01;
  initializer_list<unsigned_long> dims_02;
  initializer_list<unsigned_long> dims_03;
  initializer_list<unsigned_long> dims_04;
  initializer_list<unsigned_long> dims_05;
  initializer_list<unsigned_long> dims_06;
  TensorShape local_3e0;
  TensorShape local_3b8;
  string_view local_390;
  TensorShape local_380;
  TensorShape local_358;
  string_view local_330;
  TensorShape local_320;
  TensorShape local_2f8;
  string_view local_2d0;
  TensorShape local_2c0;
  TensorShape local_298;
  string_view local_270;
  unsigned_long local_260 [2];
  iterator local_250;
  undefined8 local_248;
  undefined1 local_240 [8];
  TensorShape b_shape4;
  undefined1 local_1f8 [8];
  TensorShape w_shape4;
  undefined1 local_1b0 [8];
  TensorShape b_shape3;
  undefined1 local_168 [8];
  TensorShape w_shape3;
  undefined1 local_120 [8];
  TensorShape b_shape2;
  undefined1 local_d8 [8];
  TensorShape w_shape2;
  undefined1 local_90 [8];
  TensorShape b_shape1;
  unsigned_long local_58 [2];
  iterator local_48;
  undefined8 local_40;
  undefined1 local_38 [8];
  TensorShape w_shape1;
  MyNN *this_local;
  
  w_shape1.dims.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  yyml::nn::NN::NN(&this->super_NN);
  (this->super_NN)._vptr_NN = (_func_int **)&PTR_Forward_00128ba0;
  local_58[0] = 2;
  local_58[1] = 0x10;
  local_48 = local_58;
  local_40 = 2;
  dims_06._M_len = 2;
  dims_06._M_array = local_48;
  yyml::TensorShape::TensorShape((TensorShape *)local_38,dims_06);
  w_shape2.dims.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x1;
  dims_05._M_len = 2;
  dims_05._M_array =
       (iterator)
       &w_shape2.dims.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage;
  yyml::TensorShape::TensorShape((TensorShape *)local_90,dims_05);
  b_shape2.dims.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x10;
  dims_04._M_len = 2;
  dims_04._M_array =
       (iterator)
       &b_shape2.dims.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage;
  yyml::TensorShape::TensorShape((TensorShape *)local_d8,dims_04);
  w_shape3.dims.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x1;
  dims_03._M_len = 2;
  dims_03._M_array =
       (iterator)
       &w_shape3.dims.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage;
  yyml::TensorShape::TensorShape((TensorShape *)local_120,dims_03);
  b_shape3.dims.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x20;
  dims_02._M_len = 2;
  dims_02._M_array =
       (iterator)
       &b_shape3.dims.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage;
  yyml::TensorShape::TensorShape((TensorShape *)local_168,dims_02);
  w_shape4.dims.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x1;
  dims_01._M_len = 2;
  dims_01._M_array =
       (iterator)
       &w_shape4.dims.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage;
  yyml::TensorShape::TensorShape((TensorShape *)local_1b0,dims_01);
  b_shape4.dims.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x10;
  dims_00._M_len = 2;
  dims_00._M_array =
       (iterator)
       &b_shape4.dims.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage;
  yyml::TensorShape::TensorShape((TensorShape *)local_1f8,dims_00);
  local_260[0] = 1;
  local_260[1] = 1;
  local_250 = local_260;
  local_248 = 2;
  dims._M_len = 2;
  dims._M_array = local_250;
  yyml::TensorShape::TensorShape((TensorShape *)local_240,dims);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_270,"dense1");
  yyml::TensorShape::TensorShape(&local_298,(TensorShape *)local_38);
  yyml::TensorShape::TensorShape(&local_2c0,(TensorShape *)local_90);
  yyml::nn::NN::SetLayer<yyml::nn::DenseLayer,yyml::TensorShape,yyml::TensorShape>
            (&this->super_NN,local_270,&local_298,&local_2c0);
  yyml::TensorShape::~TensorShape(&local_2c0);
  yyml::TensorShape::~TensorShape(&local_298);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_2d0,"dense2");
  yyml::TensorShape::TensorShape(&local_2f8,(TensorShape *)local_d8);
  yyml::TensorShape::TensorShape(&local_320,(TensorShape *)local_120);
  yyml::nn::NN::SetLayer<yyml::nn::DenseLayer,yyml::TensorShape,yyml::TensorShape>
            (&this->super_NN,local_2d0,&local_2f8,&local_320);
  yyml::TensorShape::~TensorShape(&local_320);
  yyml::TensorShape::~TensorShape(&local_2f8);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_330,"dense3");
  yyml::TensorShape::TensorShape(&local_358,(TensorShape *)local_168);
  yyml::TensorShape::TensorShape(&local_380,(TensorShape *)local_1b0);
  yyml::nn::NN::SetLayer<yyml::nn::DenseLayer,yyml::TensorShape,yyml::TensorShape>
            (&this->super_NN,local_330,&local_358,&local_380);
  yyml::TensorShape::~TensorShape(&local_380);
  yyml::TensorShape::~TensorShape(&local_358);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_390,"dense4");
  yyml::TensorShape::TensorShape(&local_3b8,(TensorShape *)local_1f8);
  yyml::TensorShape::TensorShape(&local_3e0,(TensorShape *)local_240);
  yyml::nn::NN::SetLayer<yyml::nn::DenseLayer,yyml::TensorShape,yyml::TensorShape>
            (&this->super_NN,local_390,&local_3b8,&local_3e0);
  yyml::TensorShape::~TensorShape(&local_3e0);
  yyml::TensorShape::~TensorShape(&local_3b8);
  yyml::TensorShape::~TensorShape((TensorShape *)local_240);
  yyml::TensorShape::~TensorShape((TensorShape *)local_1f8);
  yyml::TensorShape::~TensorShape((TensorShape *)local_1b0);
  yyml::TensorShape::~TensorShape((TensorShape *)local_168);
  yyml::TensorShape::~TensorShape((TensorShape *)local_120);
  yyml::TensorShape::~TensorShape((TensorShape *)local_d8);
  yyml::TensorShape::~TensorShape((TensorShape *)local_90);
  yyml::TensorShape::~TensorShape((TensorShape *)local_38);
  return;
}

Assistant:

MyNN() {
    TensorShape w_shape1{2, 16}, b_shape1{1, 16};
    TensorShape w_shape2{16, 32}, b_shape2{1, 32};
    TensorShape w_shape3{32, 16}, b_shape3{1, 16};
    TensorShape w_shape4{16, 1}, b_shape4{1, 1};
    SetLayer<DenseLayer>("dense1", w_shape1, b_shape1);
    SetLayer<DenseLayer>("dense2", w_shape2, b_shape2);
    SetLayer<DenseLayer>("dense3", w_shape3, b_shape3);
    SetLayer<DenseLayer>("dense4", w_shape4, b_shape4);
  }